

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptrace.cpp
# Opt level: O0

void cpptrace::print_frame
               (ostream *stream,bool color,uint frame_number_width,size_t counter,
               stacktrace_frame *frame)

{
  bool bVar1;
  char *pcVar2;
  char **ppcVar3;
  char **in_R9;
  _Alloc_hider in_stack_fffffffffffffeb8;
  string local_128;
  string local_108;
  string local_e8;
  char *local_c8;
  string local_c0;
  char local_90 [8];
  string local_88;
  undefined1 local_68 [8];
  string line;
  char *blue;
  char *yellow;
  char *green;
  char *reset;
  stacktrace_frame *frame_local;
  size_t counter_local;
  uint frame_number_width_local;
  bool color_local;
  ostream *stream_local;
  
  green = "";
  if (color) {
    green = "\x1b[0m";
  }
  yellow = "";
  if (color) {
    yellow = "\x1b[32m";
  }
  blue = "";
  if (color) {
    blue = "\x1b[33m";
  }
  pcVar2 = "";
  if (color) {
    pcVar2 = "\x1b[34m";
  }
  line.field_2._8_8_ = pcVar2;
  reset = (char *)frame;
  frame_local = (stacktrace_frame *)counter;
  counter_local._0_4_ = frame_number_width;
  counter_local._7_1_ = color;
  _frame_number_width_local = stream;
  microfmt::format<unsigned_int&,unsigned_long&>
            ((string *)local_68,(microfmt *)"#{<{}} ",(char *)&counter_local,(uint *)&frame_local,
             &frame->raw_address);
  if ((reset[0x58] & 1U) == 0) {
    local_c8 = (char *)0x10;
    in_R9 = &green;
    microfmt::format<char_const*const&,unsigned_long,unsigned_long_const&,char_const*const&>
              (&local_c0,(microfmt *)"{}0x{>{}:0h}{}",line.field_2._M_local_buf + 8,&local_c8,
               (unsigned_long *)reset,(unsigned_long *)in_R9,(char **)in_stack_fffffffffffffeb8._M_p
              );
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
               &local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  else {
    local_90[0] = '\x12';
    local_90[1] = '\0';
    local_90[2] = '\0';
    local_90[3] = '\0';
    local_90[4] = '\0';
    local_90[5] = '\0';
    local_90[6] = '\0';
    local_90[7] = '\0';
    microfmt::format<unsigned_long,char_const(&)[10]>
              (&local_88,(microfmt *)"{<{}}",local_90,(unsigned_long *)"(inlined)",
               (char (*) [10])frame);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
               &local_88);
    std::__cxx11::string::~string((string *)&local_88);
  }
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (reset + 0x38));
  if (!bVar1) {
    microfmt::format<char_const*const&,std::__cxx11::string_const&,char_const*const&>
              (&local_e8,(microfmt *)" in {}{}{}",(char *)&blue,(char **)(reset + 0x38),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&green,in_R9);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
               &local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (reset + 0x18));
  if (!bVar1) {
    microfmt::format<char_const*const&,std::__cxx11::string_const&,char_const*const&>
              (&local_108,(microfmt *)" at {}{}{}",(char *)&yellow,(char **)(reset + 0x18),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&green,in_R9);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
               &local_108);
    std::__cxx11::string::~string((string *)&local_108);
    bVar1 = nullable<unsigned_int,_0>::has_value((nullable<unsigned_int,_0> *)(reset + 0x10));
    if (bVar1) {
      ppcVar3 = (char **)nullable<unsigned_int,_0>::value
                                   ((nullable<unsigned_int,_0> *)(reset + 0x10));
      microfmt::format<char_const*const&,unsigned_int_const&,char_const*const&>
                (&local_128,(microfmt *)":{}{}{}",line.field_2._M_local_buf + 8,ppcVar3,
                 (uint *)&green,in_R9);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                 &local_128);
      std::__cxx11::string::~string((string *)&local_128);
      bVar1 = nullable<unsigned_int,_0>::has_value((nullable<unsigned_int,_0> *)(reset + 0x14));
      if (bVar1) {
        ppcVar3 = (char **)nullable<unsigned_int,_0>::value
                                     ((nullable<unsigned_int,_0> *)(reset + 0x14));
        microfmt::format<char_const*const&,unsigned_int_const&,char_const*const&>
                  ((string *)&stack0xfffffffffffffeb8,(microfmt *)":{}{}{}",
                   line.field_2._M_local_buf + 8,ppcVar3,(uint *)&green,in_R9);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffeb8);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb8);
      }
    }
  }
  std::operator<<(_frame_number_width_local,(string *)local_68);
  std::__cxx11::string::~string((string *)local_68);
  return;
}

Assistant:

void print_frame(
        std::ostream& stream,
        bool color,
        unsigned frame_number_width,
        std::size_t counter,
        const stacktrace_frame& frame
    ) {
        const auto reset   = color ? RESET : "";
        const auto green   = color ? GREEN : "";
        const auto yellow  = color ? YELLOW : "";
        const auto blue    = color ? BLUE : "";
        std::string line = microfmt::format("#{<{}} ", frame_number_width, counter);
        if(frame.is_inline) {
            line += microfmt::format("{<{}}", 2 * sizeof(frame_ptr) + 2, "(inlined)");
        } else {
            line += microfmt::format("{}0x{>{}:0h}{}", blue, 2 * sizeof(frame_ptr), frame.raw_address, reset);
        }
        if(!frame.symbol.empty()) {
            line += microfmt::format(" in {}{}{}", yellow, frame.symbol, reset);
        }
        if(!frame.filename.empty()) {
            line += microfmt::format(" at {}{}{}", green, frame.filename, reset);
            if(frame.line.has_value()) {
                line += microfmt::format(":{}{}{}", blue, frame.line.value(), reset);
                if(frame.column.has_value()) {
                    line += microfmt::format(":{}{}{}", blue, frame.column.value(), reset);
                }
            }
        }
        stream << line;
    }